

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  sqlite3_vfs *psVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  OpenMode *pOVar15;
  uint uVar16;
  long lVar17;
  char *__s2;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  byte *pbVar21;
  uint uVar22;
  int *piVar23;
  char *local_88;
  int local_80;
  uint local_74;
  char *local_40;
  
  uVar14 = *pFlags;
  if (zUri == (char *)0x0) {
    uVar22 = 0;
  }
  else {
    uVar22 = 0xffffffff;
    pcVar9 = zUri;
    do {
      uVar22 = uVar22 + 1;
      cVar1 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    } while (cVar1 != '\0');
    uVar22 = uVar22 & 0x3fffffff;
  }
  local_40 = zDefaultVfs;
  if (((uVar22 < 5) || ((uVar14 & 0x40) == 0 && sqlite3Config.bOpenUri == 0)) ||
     (zUri[4] != ':' || *(int *)zUri != 0x656c6966)) {
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      local_88 = (char *)sqlite3Malloc(uVar22 + 2);
    }
    else {
      local_88 = (char *)0x0;
    }
    if (local_88 == (char *)0x0) {
      return 7;
    }
    memcpy(local_88,zUri,(ulong)uVar22);
    (local_88 + uVar22)[0] = '\0';
    (local_88 + uVar22)[1] = '\0';
    uVar14 = uVar14 & 0xffffffbf;
    local_80 = 0;
  }
  else {
    iVar5 = uVar22 + 2;
    uVar11 = 0;
    do {
      iVar5 = iVar5 + (uint)(zUri[uVar11] == '&');
      uVar11 = uVar11 + 1;
    } while (uVar22 != uVar11);
    iVar6 = sqlite3_initialize();
    if (iVar6 == 0) {
      local_88 = (char *)sqlite3Malloc(iVar5);
    }
    else {
      local_88 = (char *)0x0;
    }
    uVar14 = uVar14 | 0x40;
    if (local_88 == (char *)0x0) {
      local_80 = 0;
      iVar5 = 1;
    }
    else {
      uVar11 = 5;
      if ((zUri[5] != '/') || (zUri[6] != '/')) {
LAB_0019f6f0:
        iVar6 = 0;
        iVar5 = 0;
LAB_0019f6fb:
        uVar11 = uVar11 & 0xffffffff;
LAB_0019f701:
        uVar22 = (uint)uVar11;
        bVar18 = zUri[(int)uVar22];
        if ((bVar18 != 0) && (bVar18 != 0x23)) {
          uVar20 = uVar22 + 1;
          uVar11 = (ulong)uVar20;
          if ((bVar18 == 0x25) &&
             ((bVar19 = zUri[(int)uVar20], (""[bVar19] & 8) != 0 &&
              (bVar2 = zUri[(long)(int)uVar22 + 2], (""[bVar2] & 8) != 0)))) goto code_r0x0019f74e;
          if ((iVar6 == 1) && ((bVar18 == 0x3d || (bVar18 == 0x26)))) {
            if (local_88[(long)iVar5 + -1] == '\0') {
              pcVar9 = zUri + (int)uVar20;
              do {
                uVar22 = uVar22 + 1;
                iVar6 = 1;
                if ((*pcVar9 == '\0') || (*pcVar9 == '#')) {
                  uVar11 = (ulong)uVar22;
                  break;
                }
                pcVar12 = pcVar9 + -1;
                uVar11 = (ulong)uVar22;
                pcVar9 = pcVar9 + 1;
              } while (*pcVar12 != '&');
              goto LAB_0019f701;
            }
            if (bVar18 == 0x26) {
              local_88[iVar5] = '\0';
              iVar5 = iVar5 + 1;
              goto LAB_0019f86c;
            }
            iVar6 = 2;
          }
          else {
            if (((iVar6 != 0) || (bVar18 != 0x3f)) && ((iVar6 != 2 || (bVar18 != 0x26))))
            goto LAB_0019f830;
LAB_0019f86c:
            iVar6 = 1;
          }
          bVar18 = 0;
          goto LAB_0019f830;
        }
        iVar7 = iVar5;
        if (iVar6 == 1) {
          iVar7 = iVar5 + 1;
          local_88[iVar5] = '\0';
        }
        (local_88 + iVar7)[0] = '\0';
        (local_88 + iVar7)[1] = '\0';
        lVar17 = -1;
        do {
          lVar10 = lVar17 + 1;
          lVar17 = lVar17 + 1;
        } while (local_88[lVar10] != '\0');
        piVar23 = (int *)(local_88 + (ulong)((uint)lVar17 & 0x3fffffff) + 1);
        local_80 = 0;
        do {
          if ((char)*piVar23 == '\0') {
            iVar5 = 0;
            break;
          }
          uVar22 = 0x3fffffff;
          lVar17 = 0;
          do {
            lVar10 = lVar17;
            uVar22 = uVar22 + 1;
            lVar17 = lVar10 + 1;
          } while (*(char *)((long)piVar23 + lVar10) != '\0');
          uVar20 = (uint)lVar10 & 0x3fffffff;
          pcVar9 = (char *)((long)piVar23 + (ulong)uVar20 + 1);
          lVar17 = -1;
          do {
            lVar10 = lVar17 + (ulong)(uVar22 & 0x3fffffff) + 2;
            lVar17 = lVar17 + 1;
          } while (*(char *)((long)piVar23 + lVar10) != '\0');
          uVar22 = (uint)lVar17;
          if (uVar20 == 5) {
            if ((char)piVar23[1] != 'e' || *piVar23 != 0x68636163) goto LAB_0019f96c;
            uVar16 = 0x60000;
            pOVar15 = sqlite3ParseUri::aCacheMode;
            pcVar12 = "cache";
LAB_0019f972:
            uVar13 = uVar16;
            if ((uVar20 == 4) && (*piVar23 == 0x65646f6d)) {
              uVar16 = uVar14 & 0x87;
              pOVar15 = sqlite3ParseUri::aOpenMode;
              pcVar12 = "access";
              uVar13 = 0x87;
            }
            bVar3 = true;
            if (pOVar15 == (OpenMode *)0x0) {
              iVar5 = 0;
            }
            else {
              __s2 = pOVar15->z;
              if (__s2 == (char *)0x0) {
                local_74 = 0;
              }
              else {
                lVar17 = 0;
                local_74 = 0;
                do {
                  lVar10 = -1;
                  do {
                    lVar4 = lVar10 + 1;
                    lVar10 = lVar10 + 1;
                  } while (__s2[lVar4] != '\0');
                  bVar3 = true;
                  if (((((uint)lVar10 ^ uVar22) & 0x3fffffff) == 0) &&
                     (iVar5 = bcmp(pcVar9,__s2,(ulong)(uVar22 & 0x3fffffff)), iVar5 == 0)) {
                    local_74 = pOVar15[lVar17].mode;
                    bVar3 = false;
                  }
                  if (!bVar3) break;
                  lVar17 = lVar17 + 1;
                  __s2 = pOVar15[lVar17].z;
                } while (__s2 != (char *)0x0);
              }
              if (local_74 == 0) {
                bVar3 = false;
                pcVar12 = sqlite3_mprintf("no such %s mode: %s",pcVar12,pcVar9);
                *pzErrMsg = pcVar12;
                local_80 = 1;
                iVar5 = 7;
              }
              else if ((int)uVar16 < (int)(local_74 & 0xffffff7f)) {
                bVar3 = false;
                pcVar12 = sqlite3_mprintf("%s mode not allowed: %s",pcVar12,pcVar9);
                *pzErrMsg = pcVar12;
                local_80 = 3;
                iVar5 = 7;
              }
              else {
                uVar14 = uVar14 & ~uVar13 | local_74;
                iVar5 = 0;
                bVar3 = true;
              }
            }
            pcVar12 = local_40;
            if (bVar3) goto LAB_0019fae6;
          }
          else {
            if ((uVar20 != 3) ||
               (pcVar12 = pcVar9, *(char *)((long)piVar23 + 2) != 's' || (short)*piVar23 != 0x6676))
            {
LAB_0019f96c:
              pOVar15 = (OpenMode *)0x0;
              pcVar12 = (char *)0x0;
              uVar16 = 0;
              goto LAB_0019f972;
            }
LAB_0019fae6:
            local_40 = pcVar12;
            piVar23 = (int *)(pcVar9 + (ulong)(uVar22 & 0x3fffffff) + 1);
            iVar5 = 0;
          }
        } while (iVar5 == 0);
        goto LAB_0019fb07;
      }
      for (lVar17 = 0; (zUri[lVar17 + 7] != '\0' && (zUri[lVar17 + 7] != '/')); lVar17 = lVar17 + 1)
      {
      }
      uVar11 = lVar17 + 7;
      if ((int)uVar11 == 0x10) {
        if (zUri[0xf] == 't' && *(long *)(zUri + 7) == 0x736f686c61636f6c) {
          uVar11 = 0x10;
          goto LAB_0019f6f0;
        }
      }
      else if ((int)uVar11 == 7) goto LAB_0019f6f0;
      pcVar9 = sqlite3_mprintf("invalid uri authority: %.*s",lVar17,zUri + 7);
      *pzErrMsg = pcVar9;
      local_80 = 1;
      iVar5 = 7;
    }
LAB_0019fb07:
    if (iVar5 != 0) {
      if (iVar5 != 7) {
        return 7;
      }
      goto LAB_0019fb24;
    }
  }
  psVar8 = sqlite3_vfs_find(local_40);
  *ppVfs = psVar8;
  if (psVar8 == (sqlite3_vfs *)0x0) {
    pcVar9 = sqlite3_mprintf("no such vfs: %s",local_40);
    *pzErrMsg = pcVar9;
    local_80 = 1;
  }
LAB_0019fb24:
  if (local_80 != 0) {
    sqlite3_free(local_88);
    local_88 = (char *)0x0;
  }
  *pFlags = uVar14;
  *pzFile = local_88;
  return local_80;
code_r0x0019f74e:
  uVar22 = uVar22 + 3;
  uVar11 = (ulong)uVar22;
  bVar19 = ((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf |
           (((char)(bVar19 * '\x02') >> 7 & 9U) + bVar19) * '\x10';
  bVar18 = bVar19;
  if (bVar19 == 0) {
    pbVar21 = (byte *)(zUri + (int)uVar22);
    do {
      uVar11 = (ulong)uVar22;
      bVar18 = *pbVar21;
      if ((((bVar18 == 0) || (bVar18 == 0x23)) || ((iVar6 == 0 && (bVar18 == 0x3f)))) ||
         ((iVar6 == 1 && ((bVar18 == 0x26 || (bVar18 == 0x3d)))))) break;
      uVar22 = uVar22 + 1;
      pbVar21 = pbVar21 + 1;
    } while ((iVar6 != 2) || (bVar18 != 0x26));
  }
  if (bVar19 != 0) goto LAB_0019f830;
  goto LAB_0019f701;
LAB_0019f830:
  lVar17 = (long)iVar5;
  iVar5 = iVar5 + 1;
  local_88[lVar17] = bVar18;
  goto LAB_0019f6fb;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */ 
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI) || sqlite3GlobalConfig.bOpenUri) 
   && nUri>=5 && memcmp(zUri, "file:", 5)==0 
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    int nByte = nUri+2;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen 
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc(nByte);
    if( !zFile ) return SQLITE_NOMEM;

    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;

      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s", 
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }else{
      iIn = 5;
    }

    /* Copy the filename and any query parameters into the zFile buffer. 
    ** Decode %HH escape codes along the way. 
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%' 
       && sqlite3Isxdigit(zUri[iIn]) 
       && sqlite3Isxdigit(zUri[iIn+1]) 
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#' 
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';

    /* Check if there were any options specified that should be interpreted 
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE }, 
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc(nUri+2);
    if( !zFile ) return SQLITE_NOMEM;
    memcpy(zFile, zUri, nUri);
    zFile[nUri] = '\0';
    zFile[nUri+1] = '\0';
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}